

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 pstore::base32::convert<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
           (uint val,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  const_reference __value;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined4 local_20;
  uint local_1c;
  uint mask;
  uint val_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  
  local_20 = 0x1f;
  local_1c = val;
  _mask = out.container;
  do {
    __value = std::array<const_char,_32UL>::operator[]
                        ((array<const_char,_32UL> *)"abcdefghijklmnopqrstuvwxyz234567",
                         (ulong)(local_1c & 0x1f));
    local_28 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&mask,0);
    this = std::
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_28);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(this,__value);
    local_1c = local_1c >> 5;
  } while (local_1c != 0);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )_mask;
}

Assistant:

OutputIterator convert (IntType val, OutputIterator out) {
            PSTORE_STATIC_ASSERT (std::is_unsigned<IntType>::value);
            constexpr auto mask = (1U << 5) - 1U;
            PSTORE_ASSERT (mask == alphabet.size () - 1U);
            do {
                *(out++) = alphabet[val & mask];
            } while (val >>= 5);
            return out;
        }